

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# basisu_transcoder.cpp
# Opt level: O2

bool basist::transcode_uastc_to_bc4
               (uastc_block *src_blk,void *pDst,bool high_quality,uint32_t chan0)

{
  undefined1 uVar1;
  bool bVar2;
  color32 block_pixels [4] [4];
  unpacked_uastc_block unpacked_src_blk;
  
  bVar2 = unpack_uastc(src_blk,&unpacked_src_blk,false,true);
  if (bVar2) {
    if (unpacked_src_blk.m_mode == 8) {
      uVar1 = *(undefined1 *)((long)(&unpacked_src_blk.m_astc + 1) + (ulong)chan0 + 8);
      *(undefined1 *)pDst = uVar1;
      *(undefined1 *)((long)pDst + 1) = uVar1;
      *(undefined4 *)((long)pDst + 2) = 0;
      *(undefined2 *)((long)pDst + 6) = 0;
    }
    else {
      unpack_uastc(&unpacked_src_blk,block_pixels[0],false);
      encode_bc4(pDst,block_pixels[0][0].field_0.c + chan0,4);
    }
  }
  return bVar2;
}

Assistant:

bool transcode_uastc_to_bc4(const uastc_block& src_blk, void* pDst, bool high_quality, uint32_t chan0)
	{
		BASISU_NOTE_UNUSED(high_quality);

		unpacked_uastc_block unpacked_src_blk;
		if (!unpack_uastc(src_blk, unpacked_src_blk, false))
			return false;

		const uint32_t mode = unpacked_src_blk.m_mode;

		void* pBC4_block = pDst;

		if (mode == UASTC_MODE_INDEX_SOLID_COLOR)
		{
			write_bc4_solid_block(static_cast<uint8_t*>(pBC4_block), unpacked_src_blk.m_solid_color.c[chan0]);
			return true;
		}

		color32 block_pixels[4][4];
		const bool unpack_srgb = false;
		if (!unpack_uastc(unpacked_src_blk, &block_pixels[0][0], unpack_srgb))
			return false;

		basist::encode_bc4(pBC4_block, &block_pixels[0][0].c[chan0], sizeof(color32));

		return true;
	}